

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

RuntimeFunction * __thiscall
Js::JavascriptLibrary::DefaultCreateFunction
          (JavascriptLibrary *this,FunctionInfo *functionInfo,int length,DynamicObject *prototype,
          DynamicType *functionType,PropertyId nameId)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this_00;
  undefined4 *puVar3;
  Var nameId_00;
  RuntimeFunction *pRVar4;
  PropertyId nameId_local;
  DynamicType *functionType_local;
  DynamicObject *prototype_local;
  int length_local;
  FunctionInfo *functionInfo_local;
  JavascriptLibrary *this_local;
  
  if (0xf < (uint)nameId) {
    this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                        (&(this->super_JavascriptLibraryBase).scriptContext);
    bVar2 = ScriptContext::IsTrackedPropertyId(this_00,nameId);
    if (bVar2) goto LAB_01161397;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                              ,0x1348,
                              "(nameId >= Js::InternalPropertyIds::Count && scriptContext->IsTrackedPropertyId(nameId))"
                              ,
                              "nameId >= Js::InternalPropertyIds::Count && scriptContext->IsTrackedPropertyId(nameId)"
                             );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 0;
LAB_01161397:
  nameId_00 = TaggedInt::ToVarUnchecked(nameId);
  pRVar4 = DefaultCreateFunction(this,functionInfo,length,prototype,functionType,nameId_00);
  return pRVar4;
}

Assistant:

RuntimeFunction* JavascriptLibrary::DefaultCreateFunction(FunctionInfo * functionInfo, int length, DynamicObject * prototype, DynamicType * functionType, PropertyId nameId)
    {
        Assert(nameId >= Js::InternalPropertyIds::Count && scriptContext->IsTrackedPropertyId(nameId));
        return DefaultCreateFunction(functionInfo, length, prototype, functionType, TaggedInt::ToVarUnchecked((int)nameId));
    }